

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

string * cmGeneratorExpression::StripEmptyListElements(string *__return_storage_ptr__,string *input)

{
  uint uVar1;
  long lVar2;
  reference pcVar3;
  bool bVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  char local_41;
  char *pcStack_40;
  bool skipSemiColons;
  char *last;
  char *c;
  undefined1 local_19;
  string *local_18;
  string *input_local;
  string *result;
  
  local_18 = input;
  input_local = __return_storage_ptr__;
  lVar2 = std::__cxx11::string::find((char)input,0x3b);
  if (lVar2 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
  }
  else {
    local_19 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    pcStack_40 = (char *)std::__cxx11::string::c_str();
    local_41 = '\x01';
    for (last = pcStack_40; *last != '\0'; last = last + 1) {
      if (*last == ';') {
        if (local_41 != '\0') {
          std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcStack_40);
          pcStack_40 = last + 1;
        }
        local_41 = '\x01';
      }
      else {
        local_41 = '\0';
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar1 = std::__cxx11::string::empty();
    bVar4 = false;
    if ((uVar1 & 1) == 0) {
      local_58._M_current = (char *)std::__cxx11::string::end();
      local_50 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator-(&local_58,1);
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      bVar4 = *pcVar3 == ';';
    }
    if (bVar4) {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpression::StripEmptyListElements(
  const std::string& input)
{
  if (input.find(';') == std::string::npos) {
    return input;
  }
  std::string result;
  result.reserve(input.size());

  const char* c = input.c_str();
  const char* last = c;
  bool skipSemiColons = true;
  for (; *c; ++c) {
    if (*c == ';') {
      if (skipSemiColons) {
        result.append(last, c - last);
        last = c + 1;
      }
      skipSemiColons = true;
    } else {
      skipSemiColons = false;
    }
  }
  result.append(last);

  if (!result.empty() && *(result.end() - 1) == ';') {
    result.resize(result.size() - 1);
  }

  return result;
}